

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlcdnumber.cpp
# Opt level: O2

void QLCDNumber::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  uint *puVar1;
  double *pdVar2;
  byte bVar3;
  uint uVar4;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      overflow((QLCDNumber *)_o);
      return;
    case 1:
      display((QLCDNumber *)_o,(QString *)_a[1]);
      return;
    case 2:
      pdVar2 = (double *)_a[1];
switchD_003ea2ad_caseD_5:
      display((QLCDNumber *)_o,*(int *)pdVar2);
      return;
    case 3:
      pdVar2 = (double *)_a[1];
switchD_003ea2ad_caseD_4:
      display((QLCDNumber *)_o,*pdVar2);
      return;
    case 4:
      setHexMode((QLCDNumber *)_o);
      return;
    case 5:
      setDecMode((QLCDNumber *)_o);
      return;
    case 6:
      setOctMode((QLCDNumber *)_o);
      return;
    case 7:
      setBinMode((QLCDNumber *)_o);
      return;
    case 8:
      pdVar2 = (double *)_a[1];
switchD_003ea2ad_caseD_0:
      setSmallDecimalPoint((QLCDNumber *)_o,*(bool *)pdVar2);
      return;
    }
    break;
  case ReadProperty:
    if ((uint)_id < 6) {
      puVar1 = (uint *)*_a;
      switch(_id) {
      case 0:
        *(byte *)puVar1 = *(byte *)(*(long *)(_o + 8) + 0x288) >> 2 & 1;
        return;
      case 1:
        uVar4 = *(uint *)(*(long *)(_o + 8) + 0x278);
        break;
      case 2:
        uVar4 = *(byte *)(*(long *)(_o + 8) + 0x288) & 3;
        break;
      case 3:
        bVar3 = *(byte *)(*(long *)(_o + 8) + 0x288) & 0x18;
        uVar4 = 0;
        if (bVar3 != 0x10) {
          uVar4 = (bVar3 != 0x18) + 1;
        }
        *puVar1 = uVar4;
        return;
      case 4:
        *(undefined8 *)puVar1 = *(undefined8 *)(*(long *)(_o + 8) + 0x280);
        return;
      case 5:
        uVar4 = (uint)((double)((ulong)*(double *)(*(long *)(_o + 8) + 0x280) & 0x8000000000000000 |
                               (ulong)DAT_005e55c0) + *(double *)(*(long *)(_o + 8) + 0x280));
      }
      *puVar1 = uVar4;
      return;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 6) {
      pdVar2 = (double *)*_a;
      switch(_id) {
      case 0:
        goto switchD_003ea2ad_caseD_0;
      case 1:
        setDigitCount((QLCDNumber *)_o,*(int *)pdVar2);
        return;
      case 2:
        setMode((QLCDNumber *)_o,*(Mode *)pdVar2);
        return;
      case 3:
        setSegmentStyle((QLCDNumber *)_o,*(SegmentStyle *)pdVar2);
        return;
      case 4:
        goto switchD_003ea2ad_caseD_4;
      }
      goto switchD_003ea2ad_caseD_5;
    }
    break;
  case IndexOfMethod:
    QtMocHelpers::indexOfMethod<void(QLCDNumber::*)()>((QtMocHelpers *)_a,(void **)overflow,0,0);
    return;
  }
  return;
}

Assistant:

void QLCDNumber::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLCDNumber *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->overflow(); break;
        case 1: _t->display((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->display((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->display((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 4: _t->setHexMode(); break;
        case 5: _t->setDecMode(); break;
        case 6: _t->setOctMode(); break;
        case 7: _t->setBinMode(); break;
        case 8: _t->setSmallDecimalPoint((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLCDNumber::*)()>(_a, &QLCDNumber::overflow, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->smallDecimalPoint(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->digitCount(); break;
        case 2: *reinterpret_cast<Mode*>(_v) = _t->mode(); break;
        case 3: *reinterpret_cast<SegmentStyle*>(_v) = _t->segmentStyle(); break;
        case 4: *reinterpret_cast<double*>(_v) = _t->value(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->intValue(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSmallDecimalPoint(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setDigitCount(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setMode(*reinterpret_cast<Mode*>(_v)); break;
        case 3: _t->setSegmentStyle(*reinterpret_cast<SegmentStyle*>(_v)); break;
        case 4: _t->display(*reinterpret_cast<double*>(_v)); break;
        case 5: _t->display(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}